

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_user_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  SessionHandle *data_00;
  void *pvVar1;
  CURLcode CVar2;
  char *local_50;
  ftp_conn *ftpc;
  FTP *ftp;
  SessionHandle *data;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  pvVar1 = (data_00->req).protop;
  if ((ftpcode == 0x14b) && ((conn->proto).ftpc.state == FTP_USER)) {
    if (*(long *)((long)pvVar1 + 0x10) == 0) {
      local_50 = "";
    }
    else {
      local_50 = *(char **)((long)pvVar1 + 0x10);
    }
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PASS %s",local_50);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    _state(conn,FTP_PASS);
    data._4_4_ = CURLE_OK;
  }
  else if (ftpcode / 100 == 2) {
    data._4_4_ = ftp_state_loggedin(conn);
  }
  else if (ftpcode == 0x14c) {
    if ((data_00->set).str[7] == (char *)0x0) {
      Curl_failf(data_00,"ACCT requested but none available",(long)ftpcode % 100 & 0xffffffff);
      data._4_4_ = CURLE_LOGIN_DENIED;
    }
    else {
      CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"ACCT %s",(data_00->set).str[7]);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      _state(conn,FTP_ACCT);
      data._4_4_ = CURLE_OK;
    }
  }
  else if (((conn->data->set).str[8] == (char *)0x0) ||
          (((conn->data->state).ftp_trying_alternative & 1U) != 0)) {
    Curl_failf(data_00,"Access denied: %03d",(ulong)(uint)ftpcode);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  else {
    CVar2 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",(conn->data->set).str[8]);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    (conn->data->state).ftp_trying_alternative = true;
    _state(conn,FTP_USER);
    data._4_4_ = CURLE_OK;
  }
  return data._4_4_;
}

Assistant:

static CURLcode ftp_state_user_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  (void)instate; /* no use for this yet */

  /* some need password anyway, and others just return 2xx ignored */
  if((ftpcode == 331) && (ftpc->state == FTP_USER)) {
    /* 331 Password required for ...
       (the server requires to send the user's password too) */
    PPSENDF(&ftpc->pp, "PASS %s", ftp->passwd?ftp->passwd:"");
    state(conn, FTP_PASS);
  }
  else if(ftpcode/100 == 2) {
    /* 230 User ... logged in.
       (the user logged in with or without password) */
    result = ftp_state_loggedin(conn);
  }
  else if(ftpcode == 332) {
    if(data->set.str[STRING_FTP_ACCOUNT]) {
      PPSENDF(&ftpc->pp, "ACCT %s", data->set.str[STRING_FTP_ACCOUNT]);
      state(conn, FTP_ACCT);
    }
    else {
      failf(data, "ACCT requested but none available");
      result = CURLE_LOGIN_DENIED;
    }
  }
  else {
    /* All other response codes, like:

    530 User ... access denied
    (the server denies to log the specified user) */

    if(conn->data->set.str[STRING_FTP_ALTERNATIVE_TO_USER] &&
        !conn->data->state.ftp_trying_alternative) {
      /* Ok, USER failed.  Let's try the supplied command. */
      PPSENDF(&conn->proto.ftpc.pp, "%s",
              conn->data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]);
      conn->data->state.ftp_trying_alternative = TRUE;
      state(conn, FTP_USER);
      result = CURLE_OK;
    }
    else {
      failf(data, "Access denied: %03d", ftpcode);
      result = CURLE_LOGIN_DENIED;
    }
  }
  return result;
}